

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableDrawBorders(ImGuiTable *table)

{
  float *pfVar1;
  ImVec2 *pIVar2;
  char cVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *draw_list;
  ImU32 IVar5;
  uint uVar6;
  ImGuiCol idx;
  int iVar7;
  ulong uVar8;
  ImGuiTableColumn *pIVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float local_7c;
  ImVec2 local_78;
  float local_70;
  int local_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pIVar4 = table->OuterWindow;
  fVar13 = (pIVar4->ClipRect).Max.y;
  pfVar1 = &(table->OuterRect).Min.y;
  if ((((*pfVar1 <= fVar13 && fVar13 != *pfVar1) &&
       (fVar13 = (table->OuterRect).Max.y, pfVar1 = &(pIVar4->ClipRect).Min.y,
       *pfVar1 <= fVar13 && fVar13 != *pfVar1)) &&
      (fVar13 = (pIVar4->ClipRect).Max.x,
      (table->OuterRect).Min.x <= fVar13 && fVar13 != (table->OuterRect).Min.x)) &&
     (fVar13 = (table->OuterRect).Max.x,
     (pIVar4->ClipRect).Min.x <= fVar13 && fVar13 != (pIVar4->ClipRect).Min.x)) {
    draw_list = table->InnerWindow->DrawList;
    ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,draw_list,0);
    ImDrawList::PushClipRect
              (draw_list,(table->Bg0ClipRectForDrawCmd).Min,(table->Bg0ClipRectForDrawCmd).Max,false
              );
    fVar13 = (table->InnerRect).Min.y;
    fVar14 = (table->InnerRect).Max.y;
    local_7c = fVar13;
    if (table->IsUsingHeaders == true) {
      fVar11 = fVar13;
      if (table->FreezeRowsCount < '\x01') {
        fVar11 = (table->WorkRect).Min.y;
      }
      fVar11 = fVar11 + table->LastFirstRowHeight;
      local_7c = fVar14;
      if (fVar11 <= fVar14) {
        local_7c = fVar11;
      }
    }
    uVar6 = table->Flags;
    if (((uVar6 >> 9 & 1) != 0) && (0 < table->ColumnsCount)) {
      fVar11 = (float)(int)fVar13;
      local_6c = (int)fVar13 + 1;
      uVar8 = 0;
      local_68 = ZEXT416((uint)fVar13);
      local_48 = ZEXT416((uint)fVar11);
      local_70 = fVar14;
      do {
        if ((table->EnabledMaskByDisplayOrder >> (uVar8 & 0x3f) & 1) != 0) {
          cVar3 = (table->DisplayOrderToIndex).Data[uVar8];
          if (table->ResizedColumn == cVar3) {
            bVar10 = table->InstanceInteracted == table->InstanceCurrent;
          }
          else {
            bVar10 = false;
          }
          pIVar9 = (table->Columns).Data + cVar3;
          fVar12 = pIVar9->MaxX;
          pIVar2 = &(table->InnerClipRect).Max;
          if (((fVar12 < pIVar2->x || fVar12 == pIVar2->x) || bVar10) &&
             ((((pIVar9->NextEnabledColumn != -1 || ((pIVar9->Flags & 0x40000010U) == 0)) ||
               ((table->Flags & 0x1e000U) == 0x4000)) && ((pIVar9->ClipRect).Min.x < fVar12)))) {
            fVar12 = fVar14;
            if (((table->FreezeColumnsCount == -1 ||
                 uVar8 + 1 != (ulong)(uint)(int)table->FreezeColumnsCount) && !bVar10) &&
                table->HoveredColumnBorder != cVar3) {
              bVar10 = (table->Flags & 0x1800) == 0;
              if (!bVar10) {
                fVar12 = local_7c;
              }
              IVar5 = table->RowBgColor[(ulong)bVar10 + 2];
            }
            else {
              if (bVar10) {
                idx = 0x1d;
              }
              else {
                if (table->HoveredColumnBorder != cVar3) {
                  IVar5 = table->BorderColorStrong;
                  goto LAB_0015d329;
                }
                idx = 0x1c;
              }
              IVar5 = GetColorU32(idx,1.0);
              fVar12 = local_70;
              fVar13 = (float)local_68._0_4_;
              fVar14 = local_70;
              fVar11 = (float)local_48._0_4_;
            }
LAB_0015d329:
            if ((fVar13 < fVar12) && (fVar11 < fVar12)) {
              local_58._0_4_ = fVar12;
              iVar7 = local_6c;
              do {
                local_78.x = pIVar9->MaxX + -0.1;
                local_78.y = fVar11;
                ImDrawList::AddText(draw_list,&local_78,IVar5,"|",(char *)0x0);
                fVar11 = (float)iVar7;
                iVar7 = iVar7 + 1;
              } while (fVar11 < (float)local_58._0_4_);
              fVar13 = (float)local_68._0_4_;
              fVar14 = local_70;
              fVar11 = (float)local_48._0_4_;
            }
          }
        }
        uVar8 = uVar8 + 1;
      } while ((long)uVar8 < (long)table->ColumnsCount);
      uVar6 = table->Flags;
    }
    if ((uVar6 & 0x500) != 0) {
      fVar13 = (table->OuterRect).Min.x;
      fVar14 = (table->OuterRect).Min.y;
      fVar11 = (table->OuterRect).Max.x;
      local_70 = (table->OuterRect).Max.y;
      IVar5 = table->BorderColorStrong;
      local_68._0_4_ = fVar13;
      if ((uVar6 & 0x500) == 0x500) {
        fVar12 = (float)(int)fVar14;
        if (fVar12 < local_70) {
          iVar7 = (int)fVar14;
          do {
            iVar7 = iVar7 + 1;
            local_58 = ZEXT416((uint)fVar12);
            local_78.x = fVar13;
            local_78.y = fVar12;
            ImDrawList::AddText(draw_list,&local_78,IVar5,"|",(char *)0x0);
            local_78.y = (float)local_58._0_4_;
            local_78.x = fVar11 + -2.0;
            ImDrawList::AddText(draw_list,&local_78,IVar5,"|",(char *)0x0);
            fVar12 = (float)iVar7;
            fVar13 = (float)local_68._0_4_;
          } while (fVar12 < local_70);
        }
      }
      else if (((uVar6 >> 10 & 1) != 0) && (fVar12 = (float)(int)fVar14, fVar12 < local_70)) {
        iVar7 = (int)fVar14;
        do {
          iVar7 = iVar7 + 1;
          local_58 = ZEXT416((uint)fVar12);
          local_78.x = fVar13;
          local_78.y = fVar12;
          ImDrawList::AddText(draw_list,&local_78,IVar5,"|",(char *)0x0);
          local_78.y = (float)local_58._0_4_;
          local_78.x = fVar11 + -2.0;
          ImDrawList::AddText(draw_list,&local_78,IVar5,"|",(char *)0x0);
          fVar12 = (float)iVar7;
          fVar13 = (float)local_68._0_4_;
        } while (fVar12 < local_70);
      }
    }
    ImDrawList::PopClipRect(draw_list);
  }
  return;
}

Assistant:

void ImGui::TableDrawBorders(ImGuiTable* table)
{
    ImGuiWindow* inner_window = table->InnerWindow;
    if (!table->OuterWindow->ClipRect.Overlaps(table->OuterRect))
        return;

    ImDrawList* inner_drawlist = inner_window->DrawList;
    table->DrawSplitter.SetCurrentChannel(inner_drawlist, TABLE_DRAW_CHANNEL_BG0);
    inner_drawlist->PushClipRect(table->Bg0ClipRectForDrawCmd.Min, table->Bg0ClipRectForDrawCmd.Max, false);

    // Draw inner border and resizing feedback
    const float border_size = TABLE_BORDER_SIZE;
    const float draw_y1 = table->InnerRect.Min.y;
    const float draw_y2_body = table->InnerRect.Max.y;
    const float draw_y2_head = table->IsUsingHeaders ? ImMin(table->InnerRect.Max.y, (table->FreezeRowsCount >= 1 ? table->InnerRect.Min.y : table->WorkRect.Min.y) + table->LastFirstRowHeight) : draw_y1;
    if (table->Flags & ImGuiTableFlags_BordersInnerV)
    {
        for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;

            const int column_n = table->DisplayOrderToIndex[order_n];
            ImGuiTableColumn* column = &table->Columns[column_n];
            const bool is_hovered = (table->HoveredColumnBorder == column_n);
            const bool is_resized = (table->ResizedColumn == column_n) && (table->InstanceInteracted == table->InstanceCurrent);
            const bool is_resizable = (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_)) == 0;
            const bool is_frozen_separator = (table->FreezeColumnsCount != -1 && table->FreezeColumnsCount == order_n + 1);
            if (column->MaxX > table->InnerClipRect.Max.x && !is_resized)
                continue;

            // Decide whether right-most column is visible
            if (column->NextEnabledColumn == -1 && !is_resizable)
                if ((table->Flags & ImGuiTableFlags_SizingMask_) != ImGuiTableFlags_SizingFixedSame || (table->Flags & ImGuiTableFlags_NoHostExtendX))
                    continue;
            if (column->MaxX <= column->ClipRect.Min.x) // FIXME-TABLE FIXME-STYLE: Assume BorderSize==1, this is problematic if we want to increase the border size..
                continue;

            // Draw in outer window so right-most column won't be clipped
            // Always draw full height border when being resized/hovered, or on the delimitation of frozen column scrolling.
            ImU32 col;
            float draw_y2;
            if (is_hovered || is_resized || is_frozen_separator)
            {
                draw_y2 = draw_y2_body;
                col = is_resized ? GetColorU32(ImGuiCol_SeparatorActive) : is_hovered ? GetColorU32(ImGuiCol_SeparatorHovered) : table->BorderColorStrong;
            }
            else
            {
                draw_y2 = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? draw_y2_head : draw_y2_body;
                col = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? table->BorderColorStrong : table->BorderColorLight;
            }

            if (draw_y2 > draw_y1) {
                //inner_drawlist->AddLine(ImVec2(column->MaxX, draw_y1), ImVec2(column->MaxX, draw_y2 - 1.0f), col, 0.1f);
                for (int y = draw_y1; y < draw_y2; ++y) {
                    inner_drawlist->AddText(ImVec2(column->MaxX - 0.1f, y), col, "|");
                }
            }
        }
    }

    // Draw outer border
    // FIXME: could use AddRect or explicit VLine/HLine helper?
    if (table->Flags & ImGuiTableFlags_BordersOuter)
    {
        // Display outer border offset by 1 which is a simple way to display it without adding an extra draw call
        // (Without the offset, in outer_window it would be rendered behind cells, because child windows are above their
        // parent. In inner_window, it won't reach out over scrollbars. Another weird solution would be to display part
        // of it in inner window, and the part that's over scrollbars in the outer window..)
        // Either solution currently won't allow us to use a larger border size: the border would clipped.
        const ImRect outer_border = table->OuterRect;
        const ImU32 outer_col = table->BorderColorStrong;
        if ((table->Flags & ImGuiTableFlags_BordersOuter) == ImGuiTableFlags_BordersOuter)
        {
            for (int y = outer_border.Min.y; y < outer_border.Max.y; ++y) {
                inner_drawlist->AddText(ImVec2(outer_border.Min.x, y), outer_col, "|");
                inner_drawlist->AddText(ImVec2(outer_border.Max.x - 2.0f, y), outer_col, "|");
            }
            //inner_drawlist->AddRect(outer_border.Min, outer_border.Max, outer_col, 0.0f, ~0, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterV)
        {
            for (int y = outer_border.Min.y; y < outer_border.Max.y; ++y) {
                inner_drawlist->AddText(ImVec2(outer_border.Min.x, y), outer_col, "|");
                inner_drawlist->AddText(ImVec2(outer_border.Max.x - 2.0f, y), outer_col, "|");
            }
            //inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Min.x, outer_border.Max.y), outer_col, border_size);
            //inner_drawlist->AddLine(ImVec2(outer_border.Max.x, outer_border.Min.y), outer_border.Max, outer_col, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterH && false)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Max.x, outer_border.Min.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Min.x, outer_border.Max.y), outer_border.Max, outer_col, border_size);
        }
    }
    if ((table->Flags & ImGuiTableFlags_BordersInnerH) && table->RowPosY2 < table->OuterRect.Max.y && false)
    {
        // Draw bottom-most row border
        const float border_y = table->RowPosY2;
        if (border_y >= table->BgClipRect.Min.y && border_y < table->BgClipRect.Max.y)
            inner_drawlist->AddLine(ImVec2(table->BorderX1, border_y), ImVec2(table->BorderX2, border_y), table->BorderColorLight, border_size);
    }

    inner_drawlist->PopClipRect();
}